

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

ssize_t __thiscall pstack::MemReader::read(MemReader *this,int __fd,void *__buf,size_t __nbytes)

{
  void *__dest;
  Exception *this_00;
  Exception *rhs;
  unsigned_long *puVar1;
  char *__src;
  undefined4 in_register_00000034;
  unsigned_long local_1e8;
  size_t local_1e0;
  size_t rc;
  Exception local_1c8;
  void *local_28;
  char *ptr_local;
  size_t count_local;
  Off off_local;
  MemReader *this_local;
  
  count_local = CONCAT44(in_register_00000034,__fd);
  local_28 = (void *)__nbytes;
  ptr_local = (char *)__buf;
  off_local = (Off)this;
  if (this->len < count_local) {
    rc._3_1_ = 1;
    this_00 = (Exception *)__cxa_allocate_exception();
    memset(&local_1c8,0,0x1a0);
    Exception::Exception(&local_1c8);
    rhs = Exception::operator<<(&local_1c8,(char (*) [24])"read past end of memory");
    Exception::Exception(this_00,rhs);
    rc._3_1_ = 0;
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  local_1e8 = this->len - count_local;
  puVar1 = std::min<unsigned_long>((unsigned_long *)&ptr_local,&local_1e8);
  __dest = local_28;
  local_1e0 = *puVar1;
  __src = anon_unknown_11::ptroff(this->data,count_local);
  memcpy(__dest,__src,local_1e0);
  return local_1e0;
}

Assistant:

size_t
MemReader::read(Off off, size_t count, char *ptr) const
{
    if (off > Off(len))
        throw (Exception() << "read past end of memory");
    size_t rc = std::min(count, len - size_t(off));
    memcpy(ptr, ptroff(data, off), rc);
    return rc;
}